

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>
          (Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
           *this,ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *s)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  
  puVar1 = *(uint64_t **)this;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar2 = ser_readdata64<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(s);
    *puVar1 = uVar2;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream &s) { Formatter().Unser(s, m_object); }